

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# music_dumb.cpp
# Opt level: O2

void __thiscall input_mod::~input_mod(input_mod *this)

{
  SoundStream *pSVar1;
  
  (this->super_StreamSong).super_MusInfo._vptr_MusInfo = (_func_int **)&PTR__input_mod_006ea428;
  StreamSong::Stop(&this->super_StreamSong);
  pSVar1 = (this->super_StreamSong).m_Stream;
  if (pSVar1 != (SoundStream *)0x0) {
    (*pSVar1->_vptr_SoundStream[1])();
    (this->super_StreamSong).m_Stream = (SoundStream *)0x0;
  }
  if (this->sr != (DUH_SIGRENDERER *)0x0) {
    duh_end_sigrenderer(this->sr);
  }
  if (this->duh != (DUH *)0x0) {
    unload_duh(this->duh);
  }
  FCriticalSection::~FCriticalSection(&this->crit_sec);
  FString::~FString(&this->FormatVersion);
  FString::~FString(&this->TrackerVersion);
  FString::~FString(&this->Codec);
  StreamSong::~StreamSong(&this->super_StreamSong);
  return;
}

Assistant:

input_mod::~input_mod()
{
	Stop();
	if (m_Stream != NULL)
	{
		delete m_Stream;
		m_Stream = NULL;
	}
	if (sr) duh_end_sigrenderer(sr);
	if (duh) unload_duh(duh);
}